

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

double smf::MidiMessage::frequencyToSemitones(double frequency,double a4frequency)

{
  double dVar1;
  double semitones;
  double a4frequency_local;
  double frequency_local;
  
  if (1.0 <= frequency) {
    if (0.0 < a4frequency) {
      dVar1 = log2(frequency / a4frequency);
      frequency_local = dVar1 * 12.0 + 69.0;
      if (frequency_local < 128.0) {
        if (frequency_local < 0.0) {
          frequency_local = 0.0;
        }
      }
      else {
        frequency_local = 127.0;
      }
    }
    else {
      frequency_local = 0.0;
    }
  }
  else {
    frequency_local = 0.0;
  }
  return frequency_local;
}

Assistant:

double MidiMessage::frequencyToSemitones(double frequency, double a4frequency) {
	if (frequency < 1) {
		return 0.0;
	}
	if (a4frequency <= 0) {
		return 0.0;
	}
	double semitones = 69.0 + 12.0 * log2(frequency/a4frequency);
	if (semitones >= 128.0) {
		return 127.0;
	} else if (semitones < 0.0) {
		return 0.0;
	}
	return semitones;
}